

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

void __thiscall
wasm::TopologicalSort<wasm::Name,_DependencySort>::stepToNext
          (TopologicalSort<wasm::Name,_DependencySort> *this)

{
  char *pcVar1;
  pointer pNVar2;
  
  pNVar2 = (this->workStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if ((this->workStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start == pNVar2) {
      return;
    }
    pcVar1 = pNVar2[-1].super_IString.str._M_str;
    ReorderGlobals::run(wasm::Module*)::DependencySort::pushPredecessors(wasm::Name_
              (this,(Name)pNVar2[-1].super_IString.str);
    pNVar2 = (this->workStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_finish;
  } while (pNVar2[-1].super_IString.str._M_str != pcVar1);
  return;
}

Assistant:

void stepToNext() {
    while (!workStack.empty()) {
      T item = workStack.back();
      static_cast<Subtype*>(this)->pushPredecessors(item);
      if (workStack.back() == item) {
        // No unfinished predecessors, so this is the next item in the sort.
        break;
      }
    }
  }